

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_greedy_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *piVar1;
  BYTE *iEnd;
  BYTE *iStart;
  BYTE *pBVar2;
  int *piVar3;
  uint uVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  BYTE *pBVar7;
  seqDef *psVar8;
  undefined8 uVar9;
  bool bVar10;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  U32 UVar18;
  U32 UVar19;
  int *piVar20;
  int *piVar21;
  int *piVar22;
  long lVar23;
  BYTE *litEnd;
  ulong uVar24;
  U32 UVar25;
  BYTE *litLimit_w;
  size_t offsetFound;
  ulong local_b8;
  U32 local_8c;
  size_t local_58;
  U32 *local_50;
  BYTE *local_48;
  ZSTD_matchState_t *local_40;
  BYTE *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  piVar3 = (int *)((long)src + (srcSize - 8));
  pBVar5 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar5 + uVar4;
  UVar19 = *rep;
  pZVar6 = ms->dictMatchState;
  pBVar7 = (pZVar6->window).nextSrc;
  local_38 = (pZVar6->window).base;
  local_48 = local_38 + (pZVar6->window).dictLimit;
  UVar25 = rep[1];
  piVar20 = (int *)((ulong)(((int)src - ((int)local_48 + (int)iStart)) + (int)pBVar7 == 0) +
                   (long)src);
  local_50 = rep;
  if (piVar20 < piVar3) {
    uVar13 = ((int)local_38 - (int)pBVar7) + uVar4;
    pBVar15 = local_38 + -(ulong)uVar13;
    piVar1 = (int *)(iEnd + -0x20);
    local_40 = ms;
    do {
      piVar21 = (int *)((long)piVar20 + 1);
      uVar11 = (((int)piVar20 - (int)pBVar5) - UVar19) + 1;
      piVar22 = (int *)(pBVar5 + uVar11);
      if (uVar11 < uVar4) {
        piVar22 = (int *)(local_38 + (uVar11 - uVar13));
      }
      bVar10 = true;
      if ((uVar11 - uVar4 < 0xfffffffd) && (*piVar22 == *piVar21)) {
        pBVar14 = iEnd;
        if (uVar11 < uVar4) {
          pBVar14 = pBVar7;
        }
        sVar12 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar20 + 5),(BYTE *)(piVar22 + 1),iEnd,pBVar14,iStart);
        uVar24 = sVar12 + 4;
        bVar10 = false;
      }
      else {
        uVar24 = 0;
      }
      local_8c = 1;
      UVar18 = UVar19;
      local_b8 = uVar24;
      if (bVar10) {
        local_58 = 999999999;
        local_b8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                             (local_40,(BYTE *)piVar20,iEnd,&local_58);
        sVar12 = local_58;
        piVar22 = piVar20;
        if (local_b8 <= uVar24) {
          local_b8 = uVar24;
          sVar12 = 0;
          piVar22 = piVar21;
        }
        piVar21 = piVar22;
        if (3 < local_b8) {
          if (sVar12 != 0) {
            pBVar16 = (BYTE *)((long)piVar21 + (-(long)pBVar5 - sVar12) + -0xfffffffe);
            pBVar17 = pBVar5;
            pBVar14 = iStart;
            if ((uint)pBVar16 < uVar4) {
              pBVar17 = pBVar15;
              pBVar14 = local_48;
            }
            if ((src < piVar21) &&
               (uVar24 = (ulong)pBVar16 & 0xffffffff, pBVar14 < pBVar17 + uVar24)) {
              pBVar17 = pBVar17 + uVar24;
              do {
                piVar20 = (int *)((long)piVar21 + -1);
                pBVar17 = pBVar17 + -1;
                if ((*(BYTE *)piVar20 != *pBVar17) ||
                   (local_b8 = local_b8 + 1, piVar21 = piVar20, piVar20 <= src)) break;
              } while (pBVar14 < pBVar17);
            }
            local_8c = (int)sVar12 + 1;
            UVar18 = (int)sVar12 - 2;
            UVar25 = UVar19;
          }
          goto LAB_005f178f;
        }
        piVar20 = (int *)((long)piVar20 + ((long)piVar20 - (long)src >> 8) + 1);
      }
      else {
LAB_005f178f:
        uVar24 = (long)piVar21 - (long)src;
        if (piVar1 < piVar21) {
          pBVar17 = seqStore->lit;
          pBVar14 = pBVar17;
          piVar20 = (int *)src;
          if (src <= piVar1) {
            pBVar14 = pBVar17 + ((long)piVar1 - (long)src);
            uVar9 = *(undefined8 *)((long)src + 8);
            *(undefined8 *)pBVar17 = *src;
            *(undefined8 *)(pBVar17 + 8) = uVar9;
            piVar20 = piVar1;
            if (0x10 < (long)piVar1 - (long)src) {
              lVar23 = 0x10;
              do {
                uVar9 = *(undefined8 *)((BYTE *)((long)src + lVar23) + 8);
                pBVar16 = pBVar17 + lVar23;
                *(undefined8 *)pBVar16 = *(undefined8 *)((long)src + lVar23);
                *(undefined8 *)(pBVar16 + 8) = uVar9;
                pBVar2 = (BYTE *)((long)src + lVar23 + 0x10);
                uVar9 = *(undefined8 *)(pBVar2 + 8);
                *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)pBVar2;
                *(undefined8 *)(pBVar16 + 0x18) = uVar9;
                lVar23 = lVar23 + 0x20;
              } while (pBVar16 + 0x20 < pBVar14);
            }
          }
          if (piVar20 < piVar21) {
            lVar23 = 0;
            do {
              pBVar14[lVar23] = *(BYTE *)((long)piVar20 + lVar23);
              lVar23 = lVar23 + 1;
            } while ((long)piVar21 - (long)piVar20 != lVar23);
          }
        }
        else {
          pBVar14 = seqStore->lit;
          uVar9 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar14 = *src;
          *(undefined8 *)(pBVar14 + 8) = uVar9;
          if (0x10 < uVar24) {
            pBVar14 = seqStore->lit;
            uVar9 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar14 + 0x18) = uVar9;
            if (0x20 < (long)uVar24) {
              lVar23 = 0;
              do {
                pBVar16 = (BYTE *)((long)src + lVar23 + 0x20);
                uVar9 = *(undefined8 *)(pBVar16 + 8);
                pBVar17 = pBVar14 + lVar23 + 0x20;
                *(undefined8 *)pBVar17 = *(undefined8 *)pBVar16;
                *(undefined8 *)(pBVar17 + 8) = uVar9;
                pBVar16 = (BYTE *)((long)src + lVar23 + 0x30);
                uVar9 = *(undefined8 *)(pBVar16 + 8);
                *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)pBVar16;
                *(undefined8 *)(pBVar17 + 0x18) = uVar9;
                lVar23 = lVar23 + 0x20;
              } while (pBVar17 + 0x20 < pBVar14 + uVar24);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar8 = seqStore->sequences;
        psVar8->litLength = (U16)uVar24;
        psVar8->offset = local_8c;
        if (0xffff < local_b8 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar8->matchLength = (U16)(local_b8 - 3);
        seqStore->sequences = psVar8 + 1;
        piVar20 = (int *)((long)piVar21 + local_b8);
        src = piVar20;
        do {
          UVar19 = UVar18;
          if (piVar3 < piVar20) break;
          uVar11 = ((int)piVar20 - (int)pBVar5) - UVar25;
          pBVar14 = pBVar5;
          if (uVar11 < uVar4) {
            pBVar14 = pBVar15;
          }
          if ((uVar11 - uVar4 < 0xfffffffd) && (*(int *)(pBVar14 + uVar11) == *piVar20)) {
            pBVar17 = iEnd;
            if (uVar11 < uVar4) {
              pBVar17 = pBVar7;
            }
            sVar12 = ZSTD_count_2segments
                               ((BYTE *)(piVar20 + 1),(BYTE *)((long)(pBVar14 + uVar11) + 4),iEnd,
                                pBVar17,iStart);
            if (src <= piVar1) {
              pBVar14 = seqStore->lit;
              uVar9 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar14 = *src;
              *(undefined8 *)(pBVar14 + 8) = uVar9;
            }
            psVar8 = seqStore->sequences;
            psVar8->litLength = 0;
            psVar8->offset = 1;
            if (0xffff < sVar12 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar8->matchLength = (U16)(sVar12 + 1);
            seqStore->sequences = psVar8 + 1;
            piVar20 = (int *)((long)piVar20 + sVar12 + 4);
            bVar10 = true;
            src = piVar20;
            UVar18 = UVar25;
          }
          else {
            bVar10 = false;
            UVar19 = UVar25;
          }
          UVar25 = UVar19;
          UVar19 = UVar18;
        } while (bVar10);
      }
    } while (piVar20 < piVar3);
  }
  *local_50 = UVar19;
  local_50[1] = UVar25;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dedicatedDictSearch);
}